

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqllogictest.cpp
# Opt level: O1

void testRunner<true,false>(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  IResultCapture *pIVar3;
  undefined8 *puVar4;
  string prev_directory;
  string initial_dbpath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string name;
  SQLLogicTestRunner runner;
  string local_3e8;
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3a8;
  size_type local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  string local_368;
  undefined1 *local_348;
  long local_340;
  undefined1 local_338 [16];
  string local_328;
  string local_308;
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  SQLLogicTestRunner local_288;
  
  pIVar3 = Catch::getResultCapture();
  (*pIVar3->_vptr_IResultCapture[0x15])(&local_348,pIVar3);
  local_3a0 = 0;
  local_398._M_local_buf[0] = '\0';
  local_3a8 = &local_398;
  bVar2 = duckdb::TestForceStorage();
  if (bVar2) {
    local_2a8[0] = local_298;
    std::__cxx11::string::_M_construct<char*>((string *)local_2a8,local_348,local_348 + local_340);
    paVar1 = &local_3e8.field_2;
    local_3e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"/","");
    local_3c8[0] = local_3b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"_","");
    duckdb::StringUtil::Replace(&local_288,local_2a8,&local_3e8,local_3c8);
    if (local_3c8[0] != local_3b8) {
      operator_delete(local_3c8[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_3e8._M_dataplus._M_p);
    }
    if (local_2a8[0] != local_298) {
      operator_delete(local_2a8[0]);
    }
    local_2c8[0] = local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2c8,local_288._vptr_SQLLogicTestRunner,
               local_288.dbpath._M_dataplus._M_p + (long)local_288._vptr_SQLLogicTestRunner);
    local_3c8[0] = local_3b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,".","");
    local_388[0] = local_378;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"_","");
    duckdb::StringUtil::Replace(&local_3e8,local_2c8,local_3c8,local_388);
    std::__cxx11::string::operator=((string *)&local_288,(string *)&local_3e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_3e8._M_dataplus._M_p);
    }
    if (local_388[0] != local_378) {
      operator_delete(local_388[0]);
    }
    if (local_3c8[0] != local_3b8) {
      operator_delete(local_3c8[0]);
    }
    if (local_2c8[0] != local_2b8) {
      operator_delete(local_2c8[0]);
    }
    local_2e8[0] = local_2d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2e8,local_288._vptr_SQLLogicTestRunner,
               local_288.dbpath._M_dataplus._M_p + (long)local_288._vptr_SQLLogicTestRunner);
    local_3c8[0] = local_3b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"\\","");
    local_388[0] = local_378;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"_","");
    duckdb::StringUtil::Replace(&local_3e8,local_2e8,local_3c8,local_388);
    std::__cxx11::string::operator=((string *)&local_288,(string *)&local_3e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_3e8._M_dataplus._M_p);
    }
    if (local_388[0] != local_378) {
      operator_delete(local_388[0]);
    }
    if (local_3c8[0] != local_3b8) {
      operator_delete(local_3c8[0]);
    }
    if (local_2e8[0] != local_2d8) {
      operator_delete(local_2e8[0]);
    }
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_368,local_288._vptr_SQLLogicTestRunner,
               local_288.dbpath._M_dataplus._M_p + (long)local_288._vptr_SQLLogicTestRunner);
    std::__cxx11::string::append((char *)&local_368);
    duckdb::TestCreatePath(&local_3e8,&local_368);
    std::__cxx11::string::operator=((string *)&local_3a8,(string *)&local_3e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_3e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p);
    }
    if (local_288._vptr_SQLLogicTestRunner != (_func_int **)&local_288.dbpath._M_string_length) {
      operator_delete(local_288._vptr_SQLLogicTestRunner);
    }
  }
  if (local_3a8 == &local_398) {
    local_328.field_2._8_8_ = local_398._8_8_;
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  }
  else {
    local_328._M_dataplus._M_p = (pointer)local_3a8;
  }
  local_328.field_2._M_allocated_capacity._1_7_ = local_398._M_allocated_capacity._1_7_;
  local_328.field_2._M_local_buf[0] = local_398._M_local_buf[0];
  local_328._M_string_length = local_3a0;
  local_3a0 = 0;
  local_398._M_local_buf[0] = '\0';
  local_3a8 = &local_398;
  duckdb::SQLLogicTestRunner::SQLLogicTestRunner(&local_288,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p);
  }
  if (Catch::IMutableContext::currentContext == (long *)0x0) {
    Catch::IMutableContext::createContext();
  }
  puVar4 = (undefined8 *)(**(code **)(*Catch::IMutableContext::currentContext + 0x20))();
  local_288.output_sql = (bool)(**(code **)(*(long *)*puVar4 + 0xb8))();
  local_288.enable_verification = true;
  local_3e8._M_string_length = 0;
  local_3e8.field_2._M_local_buf[0] = '\0';
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_308,local_348,local_348 + local_340);
  duckdb::SQLLogicTestRunner::ExecuteFile(&local_288,&local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  duckdb::ClearTestDirectory();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  duckdb::SQLLogicTestRunner::~SQLLogicTestRunner(&local_288);
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8);
  }
  if (local_348 != local_338) {
    operator_delete(local_348);
  }
  return;
}

Assistant:

static void testRunner() {
	// this is an ugly hack that uses the test case name to pass the script file
	// name if someone has a better idea...
	auto name = Catch::getResultCapture().getCurrentTestName();
	// fprintf(stderr, "%s\n", name.c_str());
	string initial_dbpath;
	if (TestForceStorage()) {
		auto storage_name = StringUtil::Replace(name, "/", "_");
		storage_name = StringUtil::Replace(storage_name, ".", "_");
		storage_name = StringUtil::Replace(storage_name, "\\", "_");
		initial_dbpath = TestCreatePath(storage_name + ".db");
	}
	SQLLogicTestRunner runner(std::move(initial_dbpath));
	runner.output_sql = Catch::getCurrentContext().getConfig()->outputSQL();
	runner.enable_verification = VERIFICATION;

	string prev_directory;

	// We assume the test working dir for extensions to be one dir above the test/sql. Note that this is very hacky.
	// however for now it suffices: we use it to run tests from out-of-tree extensions that are based on the extension
	// template which adheres to this convention.
	if (AUTO_SWITCH_TEST_DIR) {
		prev_directory = TestGetCurrentDirectory();

		std::size_t found = name.rfind("test/sql");
		if (found == std::string::npos) {
			throw InvalidInputException("Failed to auto detect working dir for test '" + name +
			                            "' because a non-standard path was used!");
		}
		auto test_working_dir = name.substr(0, found);

		// Parse the test dir automatically
		TestChangeDirectory(test_working_dir);
	}

	runner.ExecuteFile(name);

	if (AUTO_SWITCH_TEST_DIR) {
		TestChangeDirectory(prev_directory);
	}

	// clear test directory after running tests
	ClearTestDirectory();
}